

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_slot.h
# Opt level: O2

void __thiscall
cppnet::ListSlot<cppnet::BufferBlock>::~ListSlot(ListSlot<cppnet::BufferBlock> *this)

{
  this->_vptr_ListSlot = (_func_int **)&PTR__ListSlot_00127cc0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_next).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->_prev).super___weak_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

virtual ~ListSlot() {}